

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ptls_openssl_encrypt_ticket_evp
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *cb)

{
  uint8_t *puVar1;
  size_t sVar2;
  ptls_buffer_t *ppVar3;
  int iVar4;
  int iVar5;
  EVP_CIPHER_CTX *ctx;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  uchar *puVar9;
  EVP_MAC_CTX *pEVar10;
  int clen;
  size_t hlen;
  int local_54;
  ptls_buffer_t *local_50;
  uchar *local_48;
  uint8_t *local_40;
  long local_38;
  
  ctx = EVP_CIPHER_CTX_new();
  iVar4 = 0x201;
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    lVar6 = 0;
  }
  else {
    pEVar10 = (EVP_MAC_CTX *)0x0;
    local_50 = buf;
    local_40 = src.base;
    lVar6 = EVP_MAC_fetch(0,"HMAC",0);
    if (lVar6 == 0) {
      lVar6 = 0;
      goto LAB_0010c36a;
    }
    pEVar10 = (EVP_MAC_CTX *)EVP_MAC_CTX_new(lVar6);
    ppVar3 = local_50;
    if (pEVar10 != (EVP_MAC_CTX *)0x0) {
      iVar4 = ptls_buffer_reserve(local_50,src.len + 0x80);
      if (iVar4 == 0) {
        puVar1 = ppVar3->base;
        sVar2 = ppVar3->off;
        local_48 = puVar1 + sVar2;
        iVar5 = (*cb)(local_48,puVar1 + sVar2 + 0x10,(EVP_CIPHER_CTX *)ctx,pEVar10,1);
        iVar4 = 0x203;
        if (iVar5 != 0) {
          puVar9 = local_48 + 0x20;
          iVar5 = EVP_EncryptUpdate(ctx,puVar9,&local_54,local_40,(int)src.len);
          if (iVar5 != 0) {
            lVar7 = (long)local_54;
            iVar5 = EVP_EncryptFinal_ex(ctx,puVar9 + lVar7,&local_54);
            if (iVar5 != 0) {
              puVar9 = puVar9 + lVar7 + local_54;
              iVar5 = EVP_MAC_update(pEVar10,local_50->base + local_50->off,
                                     (long)puVar9 - (long)(local_50->base + local_50->off));
              if (iVar5 != 0) {
                uVar8 = EVP_MAC_CTX_get_mac_size(pEVar10);
                iVar5 = EVP_MAC_final(pEVar10,puVar9,&local_38,uVar8);
                if (iVar5 != 0) {
                  if (local_50->base + local_50->capacity < puVar9 + local_38) {
                    __assert_fail("dst <= buf->base + buf->capacity",
                                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c"
                                  ,0x81e,
                                  "int ptls_openssl_encrypt_ticket_evp(ptls_buffer_t *, ptls_iovec_t, int (*)(unsigned char *, unsigned char *, EVP_CIPHER_CTX *, EVP_MAC_CTX *, int))"
                                 );
                  }
                  local_50->off = (long)(puVar9 + local_38) - (long)local_50->base;
                  iVar4 = 0;
                }
              }
            }
          }
        }
      }
      goto LAB_0010c36a;
    }
  }
  pEVar10 = (EVP_MAC_CTX *)0x0;
LAB_0010c36a:
  if (ctx != (EVP_CIPHER_CTX *)0x0) {
    EVP_CIPHER_CTX_free(ctx);
  }
  if (pEVar10 != (EVP_MAC_CTX *)0x0) {
    EVP_MAC_CTX_free(pEVar10);
  }
  if (lVar6 != 0) {
    EVP_MAC_free(lVar6);
  }
  return iVar4;
}

Assistant:

int ptls_openssl_encrypt_ticket_evp(ptls_buffer_t *buf, ptls_iovec_t src,
                                    int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, EVP_MAC_CTX *hctx,
                                              int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    EVP_MAC *mac = NULL;
    EVP_MAC_CTX *hctx = NULL;
    size_t hlen;
    uint8_t *dst;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((mac = EVP_MAC_fetch(NULL, "HMAC", NULL)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = EVP_MAC_CTX_new(mac)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    if ((ret = ptls_buffer_reserve(buf, TICKET_LABEL_SIZE + TICKET_IV_SIZE + src.len + EVP_MAX_BLOCK_LENGTH + EVP_MAX_MD_SIZE)) !=
        0)
        goto Exit;
    dst = buf->base + buf->off;

    /* fill label and iv, as well as obtaining the keys */
    if (!(*cb)(dst, dst + TICKET_LABEL_SIZE, cctx, hctx, 1)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* encrypt */
    if (!EVP_EncryptUpdate(cctx, dst, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;
    if (!EVP_EncryptFinal_ex(cctx, dst, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;

    /* append hmac */
    if (!EVP_MAC_update(hctx, buf->base + buf->off, dst - (buf->base + buf->off)) ||
        !EVP_MAC_final(hctx, dst, &hlen, EVP_MAC_CTX_get_mac_size(hctx))) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += hlen;

    assert(dst <= buf->base + buf->capacity);
    buf->off += dst - (buf->base + buf->off);
    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        EVP_MAC_CTX_free(hctx);
    if (mac != NULL)
        EVP_MAC_free(mac);
    return ret;
}